

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O3

void reset(btbb_piconet *pn)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = pn->flags;
  if ((uVar1 >> 9 & 1) != 0) {
    free(pn->clock_candidates);
    pn->sequence = (char *)0x0;
    uVar1 = pn->flags;
  }
  pn->packets_observed = 0;
  uVar2 = uVar1 | 0x800;
  if ((uVar1 >> 0xc & 1) == 0) {
    uVar2 = uVar1 & 0xffffe1cb;
  }
  pn->flags = uVar2 & 0xffffe9cb;
  return;
}

Assistant:

static void reset(btbb_piconet *pn)
{
	//printf("no candidates remaining! starting over . . .\n");

	if(btbb_piconet_get_flag(pn, BTBB_HOP_REVERSAL_INIT)) {
		free(pn->clock_candidates);
		pn->sequence = NULL;
	}
	btbb_piconet_set_flag(pn, BTBB_GOT_FIRST_PACKET, 0);
	btbb_piconet_set_flag(pn, BTBB_HOP_REVERSAL_INIT, 0);
	btbb_piconet_set_flag(pn, BTBB_UAP_VALID, 0);
	btbb_piconet_set_flag(pn, BTBB_CLK6_VALID, 0);
	btbb_piconet_set_flag(pn, BTBB_CLK27_VALID, 0);
	pn->packets_observed = 0;

	/*
	 * If we have recently observed two packets in a row on the same
	 * channel, try AFH next time.  If not, don't.
	 */
	btbb_piconet_set_flag(pn, BTBB_IS_AFH,
			      btbb_piconet_get_flag(pn, BTBB_LOOKS_LIKE_AFH));
	btbb_piconet_set_flag(pn, BTBB_LOOKS_LIKE_AFH, 0);
	//int i;
	//for(i=0; i<10; i++)
	//	pn->afh_map[i] = 0;
}